

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
brynet::net::ConnectorWorkInfo::processConnect(ConnectorWorkInfo *this,AsyncConnectAddr *addr)

{
  bool bVar1;
  int iVar2;
  char *__cp;
  int *piVar3;
  mapped_type *this_00;
  pointer self;
  COMPLETED_CALLBACK *pCVar4;
  FAILED_CALLBACK *pFVar5;
  TcpSocket local_b0 [2];
  rep local_90;
  undefined1 local_88 [8];
  ConnectingInfo ci;
  int n;
  int check_error;
  sock clientfd;
  sockaddr_in server_addr;
  AsyncConnectAddr *addr_local;
  ConnectorWorkInfo *this_local;
  
  n = -1;
  ci.failedCB._M_invoker._4_4_ = 0;
  server_addr.sin_zero = (uchar  [8])addr;
  base::InitSocket();
  n = base::SocketCreate(2,1,0);
  if (n != -1) {
    base::SocketNonblock(n);
    check_error._0_2_ = 2;
    AsyncConnectAddr::getIP_abi_cxx11_((AsyncConnectAddr *)server_addr.sin_zero);
    __cp = (char *)std::__cxx11::string::c_str();
    inet_pton(2,__cp,&clientfd);
    iVar2 = AsyncConnectAddr::getPort((AsyncConnectAddr *)server_addr.sin_zero);
    check_error._2_2_ = htons((uint16_t)iVar2);
    ci.failedCB._M_invoker._4_4_ = connect(n,(sockaddr *)&check_error,0x10);
    if (ci.failedCB._M_invoker._4_4_ == 0) {
      pCVar4 = AsyncConnectAddr::getSuccessCB((AsyncConnectAddr *)server_addr.sin_zero);
      bVar1 = std::operator!=(pCVar4,(nullptr_t)0x0);
      if (!bVar1) {
        return;
      }
      pCVar4 = AsyncConnectAddr::getSuccessCB((AsyncConnectAddr *)server_addr.sin_zero);
      TcpSocket::Create(local_b0,n,false);
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator()(pCVar4,(unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                           *)local_b0);
      std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::~unique_ptr
                ((unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter> *)
                 local_b0);
      return;
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0x73) {
      ConnectingInfo::ConnectingInfo((ConnectingInfo *)local_88);
      local_90 = std::chrono::_V2::steady_clock::now();
      local_88 = (undefined1  [8])local_90;
      pCVar4 = AsyncConnectAddr::getSuccessCB((AsyncConnectAddr *)server_addr.sin_zero);
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator=((function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
                   *)&ci.timeout,pCVar4);
      pFVar5 = AsyncConnectAddr::getFailedCB((AsyncConnectAddr *)server_addr.sin_zero);
      std::function<void_()>::operator=((function<void_()> *)&ci.successCB._M_invoker,pFVar5);
      local_b0[0]._8_8_ = AsyncConnectAddr::getTimeout((AsyncConnectAddr *)server_addr.sin_zero);
      ci.startConnectTime.__d.__r = (duration)(duration)local_b0[0]._8_8_;
      this_00 = std::
                map<int,_brynet::net::ConnectorWorkInfo::ConnectingInfo,_std::less<int>,_std::allocator<std::pair<const_int,_brynet::net::ConnectorWorkInfo::ConnectingInfo>_>_>
                ::operator[](&this->mConnectingInfos,&n);
      ConnectingInfo::operator=(this_00,(ConnectingInfo *)local_88);
      self = std::unique_ptr<fdset_s,_brynet::net::ConnectorWorkInfo::FDSetDeleter>::get
                       (&this->mFDSet);
      ox_fdset_add(self,n,2);
      ConnectingInfo::~ConnectingInfo((ConnectingInfo *)local_88);
      return;
    }
    base::SocketClose(n);
  }
  n = -1;
  pFVar5 = AsyncConnectAddr::getFailedCB((AsyncConnectAddr *)server_addr.sin_zero);
  bVar1 = std::operator!=(pFVar5,(nullptr_t)0x0);
  if (bVar1) {
    pFVar5 = AsyncConnectAddr::getFailedCB((AsyncConnectAddr *)server_addr.sin_zero);
    std::function<void_()>::operator()(pFVar5);
  }
  return;
}

Assistant:

void ConnectorWorkInfo::processConnect(const AsyncConnectAddr& addr)
{
    struct sockaddr_in server_addr;
    sock clientfd = SOCKET_ERROR;

#if defined PLATFORM_WINDOWS
    int check_error = WSAEWOULDBLOCK;
#else
    int check_error = EINPROGRESS;
#endif
    int n = 0;

    brynet::net::base::InitSocket();

    clientfd = brynet::net::base::SocketCreate(AF_INET, SOCK_STREAM, 0);
    if (clientfd == SOCKET_ERROR)
    {
        goto FAILED;
    }

    brynet::net::base::SocketNonblock(clientfd);
    server_addr.sin_family = AF_INET;
    inet_pton(AF_INET, addr.getIP().c_str(), &server_addr.sin_addr.s_addr);
    server_addr.sin_port = htons(addr.getPort());

    n = connect(clientfd, (struct sockaddr*)&server_addr, sizeof(struct sockaddr));
    if (n == 0)
    {
        goto SUCCESS;
    }

    if (check_error != sErrno)
    {
        brynet::net::base::SocketClose(clientfd);
        clientfd = SOCKET_ERROR;
        goto FAILED;
    }

    {
        ConnectingInfo ci;
        ci.startConnectTime = std::chrono::steady_clock::now();
        ci.successCB = addr.getSuccessCB();
        ci.failedCB = addr.getFailedCB();
        ci.timeout = addr.getTimeout();

        mConnectingInfos[clientfd] = ci;
        ox_fdset_add(mFDSet.get(), clientfd, WriteCheck);
    }
    return;

SUCCESS:
    if (addr.getSuccessCB() != nullptr)
    {
        addr.getSuccessCB()(TcpSocket::Create(clientfd, false));
    }
    return;

FAILED:
    if (addr.getFailedCB() != nullptr)
    {
        addr.getFailedCB()();
    }
}